

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O1

void luaK_posfix(FuncState *fs,BinOpr op,expdesc *e1,expdesc *e2,int line)

{
  ravi_type_map rVar1;
  ravi_type_map o2_tm;
  lua_Integer lVar2;
  TString *pTVar3;
  TString *pTVar4;
  undefined4 uVar5;
  int iVar6;
  undefined4 uVar7;
  expkind eVar8;
  undefined4 uVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  OpCode OVar14;
  int iVar15;
  uint uVar16;
  OpCode OVar17;
  
  switch(op) {
  case OPR_ADD:
  case OPR_SUB:
  case OPR_MUL:
  case OPR_MOD:
  case OPR_POW:
  case OPR_DIV:
  case OPR_IDIV:
  case OPR_BAND:
  case OPR_BOR:
  case OPR_BXOR:
  case OPR_SHL:
  case OPR_SHR:
    iVar15 = constfolding(fs,op,e1,e2);
    if (iVar15 == 0) {
      OVar14 = op + OPR_EQ;
LAB_00144d54:
      codebinexpval(fs,OVar14,e1,e2,line);
      return;
    }
    break;
  case OPR_CONCAT:
    luaK_exp2val(fs,e2);
    if ((e2->k != VRELOCABLE) || (uVar12 = fs->f->code[(e2->u).info], (char)uVar12 != '\x1d')) {
      luaK_exp2nextreg(fs,e2);
      OVar14 = OP_CONCAT;
      goto LAB_00144d54;
    }
    if ((e1->u).info != (uVar12 >> 0x18) - 1) {
      __assert_fail("e1->u.info == ((int)((((fs)->f->code[(e2)->u.info]))>>24))-1",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lcode.c"
                    ,0x6be,"void luaK_posfix(FuncState *, BinOpr, expdesc *, expdesc *, int)");
    }
    if (e1->k == VNONRELOC) {
      freereg(fs,(e1->u).info);
    }
    *(undefined1 *)((long)fs->f->code + (long)(e2->u).info * 4 + 3) = *(undefined1 *)&e1->u;
    if (((byte)ravi_parser_debug & 2) != 0) {
      raviY_printf(fs,"[%d]* %o ; set A to %d\n",(long)(e2->u).info,(ulong)fs->f->code[(e2->u).info]
                   ,(ulong)(uint)(e1->u).info);
    }
    e1->k = VRELOCABLE;
    (e1->u).info = (e2->u).info;
    if ((e2->ravi_type_map == 0x100) && ((e1->ravi_type_map & 0xfffffee7) == 0)) {
      e1->ravi_type_map = 0x100;
    }
    else {
      e1->ravi_type_map = 0xffffffff;
    }
    break;
  case OPR_EQ:
  case OPR_LT:
  case OPR_LE:
  case OPR_NE:
  case OPR_GT:
  case OPR_GE:
    if (((byte)ravi_parser_debug & 1) != 0) {
      raviY_printf(fs,"Comparison of %e and %e\n",e1,e2);
    }
    if (e1->k == VNONRELOC) {
      uVar12 = (e1->u).info;
    }
    else {
      if (e1->k != VK) {
        __assert_fail("e1->k == VNONRELOC",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lcode.c"
                      ,0x5cc,"void codecomp(FuncState *, BinOpr, expdesc *, expdesc *)");
      }
      uVar12 = (e1->u).info | 0x80;
    }
    rVar1 = e1->ravi_type_map;
    uVar13 = luaK_exp2RK(fs,e2);
    o2_tm = e2->ravi_type_map;
    freeexps(fs,e1,e2);
    if (op - OPR_GT < 2) {
      OVar14 = get_type_specific_comp_op(op + OPR_LE,o2_tm,rVar1);
      iVar15 = 1;
      uVar16 = uVar13;
      uVar13 = uVar12;
    }
    else {
      uVar16 = uVar12;
      if (op == OPR_NE) {
        OVar17 = OP_EQ;
        if (o2_tm == 0x10 && rVar1 == 0x10) {
          OVar17 = OP_RAVI_EQ_FF;
        }
        OVar14 = OP_RAVI_EQ_II;
        if (o2_tm != 8 || rVar1 != 8) {
          OVar14 = OVar17;
        }
        iVar15 = 0;
      }
      else {
        OVar14 = get_type_specific_comp_op(op + OPR_GE,rVar1,o2_tm);
        iVar15 = 1;
      }
    }
    luaK_codeABC(fs,OVar14,iVar15,uVar16,uVar13);
    iVar15 = luaK_jump(fs);
    (e1->u).info = iVar15;
    e1->k = VJMP;
    e1->ravi_type_map = 6;
    break;
  case OPR_AND:
    if (e1->t != -1) {
      __assert_fail("e1->t == (-1)",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lcode.c"
                    ,0x69f,"void luaK_posfix(FuncState *, BinOpr, expdesc *, expdesc *, int)");
    }
    luaK_dischargevars(fs,e2);
    luaK_concat(fs,&e2->f,e1->f);
    uVar12 = e1->ravi_type_map;
    if (uVar12 < 4) {
      e2->ravi_type_map = uVar12;
    }
    else {
      e2->ravi_type_map = e2->ravi_type_map | uVar12 & 3;
    }
    eVar8 = e2->k;
    uVar9 = *(undefined4 *)&e2->field_0x4;
    lVar2 = (e2->u).ival;
    pTVar3 = (e2->u).ind.usertype;
    iVar10 = e2->t;
    iVar11 = e2->f;
    iVar15 = e2->f;
    rVar1 = e2->ravi_type_map;
    uVar5 = *(undefined4 *)&e2->field_0x24;
    pTVar4 = e2->usertype;
    iVar6 = e2->pc;
    uVar7 = *(undefined4 *)&e2->field_0x34;
    e1->t = e2->t;
    e1->f = iVar15;
    e1->ravi_type_map = rVar1;
    *(undefined4 *)&e1->field_0x24 = uVar5;
    e1->usertype = pTVar4;
    e1->pc = iVar6;
    *(undefined4 *)&e1->field_0x34 = uVar7;
    e1->k = eVar8;
    *(undefined4 *)&e1->field_0x4 = uVar9;
    (e1->u).ival = lVar2;
    (e1->u).ind.usertype = pTVar3;
    e1->t = iVar10;
    e1->f = iVar11;
    break;
  case OPR_OR:
    if (e1->f != -1) {
      __assert_fail("e1->f == (-1)",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lcode.c"
                    ,0x6ab,"void luaK_posfix(FuncState *, BinOpr, expdesc *, expdesc *, int)");
    }
    luaK_dischargevars(fs,e2);
    luaK_concat(fs,&e2->t,e1->t);
    uVar12 = e1->ravi_type_map;
    if ((((uVar12 & e2->ravi_type_map) >> 10 & 1) != 0) && (e1->usertype != e2->usertype)) {
      e2->usertype = (TString *)0x0;
    }
    uVar13 = e2->ravi_type_map | uVar12 & 0xfffffffc;
    if ((uVar12 & 3) == 0) {
      uVar13 = uVar12;
    }
    e2->ravi_type_map = uVar13;
    uVar5 = *(undefined4 *)&e2->field_0x4;
    lVar2 = (e2->u).ival;
    pTVar3 = (e2->u).ind.usertype;
    iVar15 = e2->t;
    iVar6 = e2->f;
    e1->k = e2->k;
    *(undefined4 *)&e1->field_0x4 = uVar5;
    (e1->u).ival = lVar2;
    (e1->u).ind.usertype = pTVar3;
    e1->t = iVar15;
    e1->f = iVar6;
    iVar15 = e2->f;
    rVar1 = e2->ravi_type_map;
    uVar5 = *(undefined4 *)&e2->field_0x24;
    pTVar3 = e2->usertype;
    iVar6 = e2->pc;
    uVar7 = *(undefined4 *)&e2->field_0x34;
    e1->t = e2->t;
    e1->f = iVar15;
    e1->ravi_type_map = rVar1;
    *(undefined4 *)&e1->field_0x24 = uVar5;
    e1->usertype = pTVar3;
    e1->pc = iVar6;
    *(undefined4 *)&e1->field_0x34 = uVar7;
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lcode.c"
                  ,0x6de,"void luaK_posfix(FuncState *, BinOpr, expdesc *, expdesc *, int)");
  }
  return;
}

Assistant:

void luaK_posfix (FuncState *fs, BinOpr op,
                  expdesc *e1, expdesc *e2, int line) {
  switch (op) {
    case OPR_AND: {
      lua_assert(e1->t == NO_JUMP);  /* list closed by 'luK_infix' */
      luaK_dischargevars(fs, e2);
      luaK_concat(fs, &e2->f, e1->f);
      if (e1->ravi_type_map & RAVI_TM_TRUISH) {
        e2->ravi_type_map |= e1->ravi_type_map & RAVI_TM_FALSISH;
      } else {
        e2->ravi_type_map = e1->ravi_type_map & RAVI_TM_FALSISH;
      }
      *e1 = *e2;
      break;
    }
    case OPR_OR: {
      lua_assert(e1->f == NO_JUMP);  /* list closed by 'luK_infix' */
      luaK_dischargevars(fs, e2);
      luaK_concat(fs, &e2->t, e1->t);
      if (e1->ravi_type_map & e2->ravi_type_map & RAVI_TM_USERDATA) {
        if (e1->usertype != e2->usertype)
          e2->usertype = NULL;
      }
      if (e1->ravi_type_map & RAVI_TM_FALSISH) {
        e2->ravi_type_map |= e1->ravi_type_map & RAVI_TM_TRUISH;
      } else {
        e2->ravi_type_map = e1->ravi_type_map & RAVI_TM_TRUISH;
      }
      *e1 = *e2;
      break;
    }
    case OPR_CONCAT: {
      luaK_exp2val(fs, e2);
      if (e2->k == VRELOCABLE &&
          GET_OPCODE(getinstruction(fs, e2)) == OP_CONCAT) {
        lua_assert(e1->u.info == GETARG_B(getinstruction(fs, e2))-1);
        freeexp(fs, e1);
        SETARG_B(getinstruction(fs, e2), e1->u.info);
        DEBUG_CODEGEN(raviY_printf(fs, "[%d]* %o ; set A to %d\n", e2->u.info, getinstruction(fs,e2), e1->u.info));
        e1->k = VRELOCABLE; e1->u.info = e2->u.info;
        if (e2->ravi_type_map == RAVI_TM_STRING &&
            (e1->ravi_type_map & (~(RAVI_TM_STRING | RAVI_TM_INTEGER | RAVI_TM_FLOAT))) == 0) {
          e1->ravi_type_map = RAVI_TM_STRING;
        }
        else {
          e1->ravi_type_map = RAVI_TM_ANY;
        }
      }
      else {
        luaK_exp2nextreg(fs, e2);  /* operand must be on the 'stack' */
        codebinexpval(fs, OP_CONCAT, e1, e2, line);
      }
      break;
    }
    case OPR_ADD: case OPR_SUB: case OPR_MUL: case OPR_DIV:
    case OPR_IDIV: case OPR_MOD: case OPR_POW:
    case OPR_BAND: case OPR_BOR: case OPR_BXOR:
    case OPR_SHL: case OPR_SHR: {
      if (!constfolding(fs, op + LUA_OPADD, e1, e2))
        codebinexpval(fs, cast(OpCode, op + OP_ADD), e1, e2, line);
      break;
    }
    case OPR_EQ: case OPR_LT: case OPR_LE:
    case OPR_NE: case OPR_GT: case OPR_GE: {
      codecomp(fs, op, e1, e2);
      break;
    }
    default: lua_assert(0);
  }
}